

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O1

Mat * __thiscall ncnn::Mat::reshape(Mat *__return_storage_ptr__,Mat *this,int _w,int _h,int _c)

{
  int *piVar1;
  ulong uVar2;
  long lVar3;
  void *pvVar4;
  int iVar5;
  void *pvVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  Mat tmp;
  Mat local_68;
  
  iVar7 = _h * _w;
  if (this->h * this->w * this->c == iVar7 * _c) {
    iVar5 = this->dims;
    lVar8 = (long)iVar7;
    if (iVar5 < 3) {
      uVar9 = this->elemsize;
      uVar2 = (uVar9 * lVar8 + 0xf & 0xfffffffffffffff0) / uVar9;
      if ((long)_h * (long)_w - uVar2 != 0) {
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->cstep = 0;
        __return_storage_ptr__->elemsize = 0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        auVar10._0_4_ = -(uint)(__return_storage_ptr__->dims == 3);
        auVar10._4_4_ = -(uint)(_w == __return_storage_ptr__->w);
        auVar10._8_4_ = -(uint)(_h == __return_storage_ptr__->h);
        auVar10._12_4_ = -(uint)(_c == __return_storage_ptr__->c);
        iVar5 = movmskps(3,auVar10);
        if ((iVar5 != 0xf) || (__return_storage_ptr__->elemsize != uVar9)) {
          piVar1 = __return_storage_ptr__->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if ((*piVar1 == 0) && (__return_storage_ptr__->data != (void *)0x0)) {
              free(*(void **)((long)__return_storage_ptr__->data + -8));
            }
          }
          __return_storage_ptr__->elemsize = 0;
          __return_storage_ptr__->dims = 0;
          __return_storage_ptr__->w = 0;
          __return_storage_ptr__->h = 0;
          __return_storage_ptr__->c = 0;
          __return_storage_ptr__->cstep = 0;
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->refcount = (int *)0x0;
          __return_storage_ptr__->elemsize = uVar9;
          __return_storage_ptr__->dims = 3;
          __return_storage_ptr__->w = _w;
          __return_storage_ptr__->h = _h;
          __return_storage_ptr__->c = _c;
          __return_storage_ptr__->cstep = uVar2;
          if (uVar2 * (long)_c != 0) {
            lVar3 = uVar2 * (long)_c * uVar9;
            pvVar4 = malloc(lVar3 + 0x1c);
            pvVar6 = (void *)((long)pvVar4 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar6 - 8) = pvVar4;
            __return_storage_ptr__->data = pvVar6;
            __return_storage_ptr__->refcount = (int *)((long)pvVar6 + lVar3);
            *(undefined4 *)((long)pvVar6 + lVar3) = 1;
          }
        }
        if (_c < 1) {
          return __return_storage_ptr__;
        }
        iVar5 = 0;
        uVar9 = 0;
        do {
          memcpy((void *)(__return_storage_ptr__->cstep * uVar9 * __return_storage_ptr__->elemsize +
                         (long)__return_storage_ptr__->data),
                 (void *)(this->elemsize * (long)iVar5 + (long)this->data),this->elemsize * lVar8);
          uVar9 = uVar9 + 1;
          iVar5 = iVar5 + iVar7;
        } while ((uint)_c != uVar9);
        return __return_storage_ptr__;
      }
    }
    else if (this->c != _c) {
      reshape(&local_68,this,iVar7 * _c);
      reshape(__return_storage_ptr__,&local_68,_w,_h,_c);
      if (local_68.refcount == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *local_68.refcount = *local_68.refcount + -1;
      UNLOCK();
      if (*local_68.refcount != 0) {
        return __return_storage_ptr__;
      }
      if (local_68.data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      free(*(void **)((long)local_68.data + -8));
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->data = this->data;
    piVar1 = this->refcount;
    __return_storage_ptr__->refcount = piVar1;
    __return_storage_ptr__->elemsize = this->elemsize;
    __return_storage_ptr__->dims = iVar5;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    iVar7 = this->h;
    __return_storage_ptr__->w = this->w;
    __return_storage_ptr__->h = iVar7;
    __return_storage_ptr__->c = this->c;
    __return_storage_ptr__->cstep = this->cstep;
    __return_storage_ptr__->dims = 3;
    __return_storage_ptr__->w = _w;
    __return_storage_ptr__->h = _h;
    __return_storage_ptr__->c = _c;
    __return_storage_ptr__->cstep =
         (lVar8 * this->elemsize + 0xf & 0xfffffffffffffff0) / this->elemsize;
  }
  else {
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->cstep = 0;
    __return_storage_ptr__->elemsize = 0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Mat Mat::reshape(int _w, int _h, int _c) const
{
    if (w * h * c != _w * _h * _c)
        return Mat();

    if (dims < 3)
    {
        if ((size_t)_w * _h != alignSize(_w * _h * elemsize, 16) / elemsize)
        {
            Mat m;
            m.create(_w, _h, _c, elemsize);

            // align channel
            for (int i=0; i<_c; i++)
            {
                const void* ptr = (unsigned char*)data + i * _w * _h * elemsize;
                void* mptr = (unsigned char*)m.data + i * m.cstep * m.elemsize;
                memcpy(mptr, ptr, _w * _h * elemsize);
            }

            return m;
        }
    }
    else if (c != _c)
    {
        // flatten and then align
        Mat tmp = reshape(_w * _h * _c);
        return tmp.reshape(_w, _h, _c);
    }

    Mat m = *this;

    m.dims = 3;
    m.w = _w;
    m.h = _h;
    m.c = _c;

    m.cstep = alignSize(_w * _h * elemsize, 16) / elemsize;

    return m;
}